

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O2

bool __thiscall RTIMUMPU9250::IMUInit(RTIMUMPU9250 *this)

{
  RTIMUSettings *pRVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uchar result;
  
  this->m_firstTime = true;
  this->m_cacheCount = 0;
  this->m_cacheIn = 0;
  this->m_cacheOut = 0;
  (this->super_RTIMU).m_imuData.fusionPoseValid = false;
  (this->super_RTIMU).m_imuData.fusionQPoseValid = false;
  (this->super_RTIMU).m_imuData.gyroValid = true;
  (this->super_RTIMU).m_imuData.accelValid = true;
  (this->super_RTIMU).m_imuData.compassValid = true;
  (this->super_RTIMU).m_imuData.pressureValid = false;
  (this->super_RTIMU).m_imuData.temperatureValid = false;
  (this->super_RTIMU).m_imuData.humidityValid = false;
  pRVar1 = (this->super_RTIMU).m_settings;
  this->m_slaveAddr = pRVar1->m_I2CSlaveAddress;
  setSampleRate(this,pRVar1->m_MPU9250GyroAccelSampleRate);
  setCompassRate(this,((this->super_RTIMU).m_settings)->m_MPU9250CompassSampleRate);
  setGyroLpf(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9250GyroLpf);
  setAccelLpf(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9250AccelLpf);
  setGyroFsr(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9250GyroFsr);
  setAccelFsr(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9250AccelFsr);
  RTIMU::setCalibrationData(&this->super_RTIMU);
  bVar2 = RTIMUHal::HALOpen(&((this->super_RTIMU).m_settings)->super_RTIMUHal);
  if (!bVar2) {
    return false;
  }
  bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'k'
                             ,0x80,"Failed to initiate MPU9250 reset");
  if (bVar2) {
    RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,100);
    bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                               'k','\0',"Failed to stop MPU9250 reset");
    if (!bVar2) {
      return false;
    }
    bVar2 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                              'u','\x01',&result,"Failed to read MPU9250 id");
    __stream = _stderr;
    if (bVar2) {
      if (result != 'q') {
        iVar3 = (*(this->super_RTIMU)._vptr_RTIMU[2])(this);
        fprintf(__stream,"Incorrect %s id %d\n",CONCAT44(extraout_var_00,iVar3),(ulong)result);
        return false;
      }
      bVar2 = setGyroConfig(this);
      if ((((bVar2) && (bVar2 = setAccelConfig(this), bVar2)) &&
          (bVar2 = setSampleRate(this), bVar2)) &&
         (((bVar2 = compassSetup(this), bVar2 && (bVar2 = setCompassRate(this), bVar2)) &&
          (bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                      this->m_slaveAddr,'k','\x01',"Failed to set pwr_mgmt_1"),
          bVar2)))) {
        bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_slaveAddr,'l','\0',"Failed to set pwr_mgmt_2");
        if (!bVar2) {
          return false;
        }
        bVar2 = resetFifo(this);
        if (bVar2) {
          RTIMU::gyroBiasInit(&this->super_RTIMU);
          iVar3 = (*(this->super_RTIMU)._vptr_RTIMU[2])(this);
          printf("%s init complete\n",CONCAT44(extraout_var,iVar3));
          fflush(_stdout);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool RTIMUMPU9250::IMUInit()
{
    unsigned char result;

    m_firstTime = true;

#ifdef MPU9250_CACHE_MODE
    m_cacheIn = m_cacheOut = m_cacheCount = 0;
#endif

    // set validity flags

    m_imuData.fusionPoseValid = false;
    m_imuData.fusionQPoseValid = false;
    m_imuData.gyroValid = true;
    m_imuData.accelValid = true;
    m_imuData.compassValid = true;
    m_imuData.pressureValid = false;
    m_imuData.temperatureValid = false;
    m_imuData.humidityValid = false;

    //  configure IMU

    m_slaveAddr = m_settings->m_I2CSlaveAddress;

    setSampleRate(m_settings->m_MPU9250GyroAccelSampleRate);
    setCompassRate(m_settings->m_MPU9250CompassSampleRate);
    setGyroLpf(m_settings->m_MPU9250GyroLpf);
    setAccelLpf(m_settings->m_MPU9250AccelLpf);
    setGyroFsr(m_settings->m_MPU9250GyroFsr);
    setAccelFsr(m_settings->m_MPU9250AccelFsr);

    setCalibrationData();


    //  enable the bus

    if (!m_settings->HALOpen())
        return false;

    //  reset the MPU9250

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_1, 0x80, "Failed to initiate MPU9250 reset"))
        return false;

    m_settings->delayMs(100);

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_1, 0x00, "Failed to stop MPU9250 reset"))
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_WHO_AM_I, 1, &result, "Failed to read MPU9250 id"))
        return false;

    if (result != MPU9250_ID) {
        HAL_ERROR2("Incorrect %s id %d\n", IMUName(), result);
        return false;
    }

    //  now configure the various components

    if (!setGyroConfig())
        return false;

    if (!setAccelConfig())
        return false;

    if (!setSampleRate())
        return false;

    if(!compassSetup()) {
        return false;
    }

    if (!setCompassRate())
        return false;

    //  enable the sensors

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_1, 1, "Failed to set pwr_mgmt_1"))
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_2, 0, "Failed to set pwr_mgmt_2"))
         return false;

    //  select the data to go into the FIFO and enable

    if (!resetFifo())
        return false;

    gyroBiasInit();

    HAL_INFO1("%s init complete\n", IMUName());
    return true;
}